

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O1

void stripctrl_locale_put_wc(StripCtrlCharsImpl *scc,wchar_t wc)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t len;
  ulong uVar4;
  ptrlen pl;
  ptrlen pl_00;
  char outbuf [16];
  char acStack_38 [24];
  
  uVar1 = mk_wcwidth(wc);
  iVar2 = iswprint(wc);
  if (((iVar2 == 0 || (int)uVar1 < 0) && (wc != L'\n')) &&
     ((wc != L'\r' || (scc->permit_cr != true)))) {
    wc = scc->substitution;
    if (wc == L'\0') {
      return;
    }
    uVar3 = mk_wcwidth(wc);
    if ((int)uVar3 < 0) {
      __assert_fail("width >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                    ,0xaa,"void stripctrl_locale_put_wc(StripCtrlCharsImpl *, wchar_t)");
    }
  }
  else {
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
  }
  if (scc->line_limit == true) {
    if (scc->line_start == true) {
      pl.len = 2;
      pl.ptr = "| ";
      BinarySink_put_datapl(scc->bs_out->binarysink_,pl);
      scc->line_start = false;
      scc->line_chars_remaining = 0x4d;
    }
    if (wc == L'\n') {
      scc->line_start = true;
    }
    else {
      uVar4 = (ulong)uVar3;
      if (scc->line_chars_remaining < uVar4) {
        pl_00.len = 4;
        pl_00.ptr = "\r\n> ";
        BinarySink_put_datapl(scc->bs_out->binarysink_,pl_00);
        scc->line_chars_remaining = 0x4d;
      }
      if (scc->line_chars_remaining < uVar4) {
        __assert_fail("width <= scc->line_chars_remaining",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,0x9c,"void stripctrl_check_line_limit(StripCtrlCharsImpl *, wchar_t, size_t)"
                     );
      }
      scc->line_chars_remaining = scc->line_chars_remaining - uVar4;
    }
  }
  len = wcrtomb(acStack_38,wc,(mbstate_t *)&scc->mbs_out);
  if (len != 0) {
    BinarySink_put_data(scc->bs_out->binarysink_,acStack_38,len);
  }
  return;
}

Assistant:

static inline void stripctrl_locale_put_wc(StripCtrlCharsImpl *scc, wchar_t wc)
{
    int width = mk_wcwidth(wc);
    if ((iswprint(wc) && width >= 0) || stripctrl_ctrlchar_ok(scc, wc)) {
        /* Printable character, or one we're going to let through anyway. */
        if (width < 0)
            width = 0;   /* sanitise for stripctrl_check_line_limit */
    } else if (scc->substitution) {
        wc = scc->substitution;
        width = mk_wcwidth(wc);
        assert(width >= 0);
    } else {
        /* No defined substitution, so don't write any output wchar_t. */
        return;
    }

    stripctrl_check_line_limit(scc, wc, width);

    char outbuf[MB_LEN_MAX];
    size_t produced = wcrtomb(outbuf, wc, &scc->mbs_out);
    if (produced > 0)
        put_data(scc->bs_out, outbuf, produced);
}